

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O3

void __thiscall
jrtplib::RTPUDPv6Transmitter::DeleteTransmissionInfo
          (RTPUDPv6Transmitter *this,RTPTransmissionInfo *i)

{
  RTPMemoryManager *pRVar1;
  
  if (this->init == true) {
    pRVar1 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
    if (pRVar1 != (RTPMemoryManager *)0x0) {
      (**i->_vptr_RTPTransmissionInfo)(i);
      (**(code **)(*(long *)pRVar1 + 0x18))(pRVar1,i);
      return;
    }
    if (i != (RTPTransmissionInfo *)0x0) {
      (*i->_vptr_RTPTransmissionInfo[1])(i);
      return;
    }
  }
  return;
}

Assistant:

void RTPUDPv6Transmitter::DeleteTransmissionInfo(RTPTransmissionInfo *i)
{
	if (!init)
		return;

	RTPDelete(i, GetMemoryManager());
}